

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<QFont::Tag,float>>
          (QDataStream *s,QMap<QFont::Tag,_float> *c)

{
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  size_t value;
  _Rb_tree_node_base *p_Var4;
  
  pQVar1 = (c->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                 *)0x0) {
    value = 0;
  }
  else {
    value = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  bVar2 = QDataStream::writeQSizeType(s,value);
  if (bVar2) {
    pQVar1 = (c->d).d.ptr;
    if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                   *)0x0) {
      p_Var3 = (_Base_ptr)0x0;
    }
    else {
      p_Var3 = *(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar1 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                   *)0x0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    for (; p_Var3 != p_Var4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      QDataStream::operator<<(s,p_Var3[1]._M_color);
      QDataStream::operator<<(s,*(float *)&p_Var3[1].field_0x4);
    }
  }
  return s;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}